

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

bool __thiscall cmGraphVizWriter::IgnoreThisTarget(cmGraphVizWriter *this,string *name)

{
  bool bVar1;
  reference this_00;
  RegularExpression *regEx;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  string *name_local;
  cmGraphVizWriter *this_local;
  
  __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                     (&this->TargetsToIgnoreRegex);
  regEx = (RegularExpression *)
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                    (&this->TargetsToIgnoreRegex);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                *)&regEx);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
              ::operator*(&__end1);
    bVar1 = cmsys::RegularExpression::is_valid(this_00);
    if ((bVar1) && (bVar1 = cmsys::RegularExpression::find(this_00,name), bVar1)) break;
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmGraphVizWriter::IgnoreThisTarget(const std::string& name)
{
  for (cmsys::RegularExpression& regEx : this->TargetsToIgnoreRegex) {
    if (regEx.is_valid()) {
      if (regEx.find(name)) {
        return true;
      }
    }
  }

  return false;
}